

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::opt::anon_unknown_15::LCSSARewriter::GetDefiningBlocks(LCSSARewriter *this,uint32_t bb_id)

{
  _Hash_node_base _Var1;
  DominatorTree *this_00;
  Instruction *pIVar2;
  iterator iVar3;
  uint32_t *puVar4;
  int *piVar5;
  int *piVar6;
  bool bVar7;
  uint32_t uVar8;
  BasicBlock *pBVar9;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar10;
  int *piVar11;
  int *piVar12;
  int iVar13;
  uint32_t *__args;
  ulong uVar14;
  long lVar15;
  __node_base *p_Var16;
  uint32_t *puVar17;
  uint32_t pred_id;
  uint32_t local_34;
  uint32_t local_30;
  uint local_2c;
  
  local_34 = bb_id;
  pBVar9 = CFG::block(this->cfg_,bb_id);
  if (pBVar9 == (BasicBlock *)0x0) {
    __assert_fail("cfg_->block(bb_id) != nullptr && \"Unknown basic block\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp"
                  ,0xdb,
                  "const std::vector<uint32_t> &spvtools::opt::(anonymous namespace)::LCSSARewriter::GetDefiningBlocks(uint32_t)"
                 );
  }
  this_01 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
            std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->bb_to_defining_blocks_,&local_34);
  if (*(long *)(this_01 + 8) != *(long *)this_01) {
    return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01;
  }
  p_Var16 = &(this->exit_bb_->_M_h)._M_before_begin;
  while (p_Var16 = p_Var16->_M_nxt, p_Var16 != (__node_base *)0x0) {
    _Var1._M_nxt = p_Var16[1]._M_nxt;
    this_00 = this->dom_tree_;
    pIVar2 = (Instruction *)_Var1._M_nxt[1]._M_nxt;
    uVar8 = 0;
    if (pIVar2->has_result_id_ == true) {
      uVar8 = Instruction::GetSingleWordOperand(pIVar2,(uint)pIVar2->has_type_id_);
    }
    bVar7 = DominatorTree::Dominates(this_00,uVar8,local_34);
    if (bVar7) {
      pIVar2 = (Instruction *)_Var1._M_nxt[1]._M_nxt;
      local_2c = 0;
      if (pIVar2->has_result_id_ == true) {
        local_2c = Instruction::GetSingleWordOperand(pIVar2,(uint)pIVar2->has_type_id_);
      }
      iVar3._M_current = *(uint **)(this_01 + 8);
      if (iVar3._M_current != *(uint **)(this_01 + 0x10)) {
        *iVar3._M_current = local_2c;
        *(uint **)(this_01 + 8) = iVar3._M_current + 1;
        return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01,iVar3,&local_2c);
      return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01;
    }
  }
  pvVar10 = CFG::preds(this->cfg_,local_34);
  puVar17 = (pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar4 = (pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar17 != puVar4) {
    do {
      local_30 = *puVar17;
      pvVar10 = GetDefiningBlocks(this,local_30);
      __args = (pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar3._M_current = *(uint **)(this_01 + 8);
      if ((long)(pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)__args == 4) {
        if (iVar3._M_current != *(uint **)(this_01 + 0x10)) {
          uVar8 = *__args;
          goto LAB_005acefc;
        }
LAB_005acf13:
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(this_01,iVar3,__args);
      }
      else {
        __args = &local_30;
        uVar8 = local_30;
        if (iVar3._M_current == *(uint **)(this_01 + 0x10)) goto LAB_005acf13;
LAB_005acefc:
        *iVar3._M_current = uVar8;
        *(uint **)(this_01 + 8) = iVar3._M_current + 1;
      }
      puVar17 = puVar17 + 1;
    } while (puVar17 != puVar4);
  }
  piVar5 = *(int **)this_01;
  piVar6 = *(int **)(this_01 + 8);
  uVar14 = (long)piVar6 - (long)piVar5;
  if (uVar14 == 0) {
    __assert_fail("defining_blocks.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp"
                  ,0xf2,
                  "const std::vector<uint32_t> &spvtools::opt::(anonymous namespace)::LCSSARewriter::GetDefiningBlocks(uint32_t)"
                 );
  }
  piVar12 = piVar5;
  if (0 < (long)uVar14 >> 4) {
    iVar13 = *piVar5;
    piVar11 = (int *)((uVar14 & 0xfffffffffffffff0) + (long)piVar5);
    lVar15 = ((long)uVar14 >> 4) + 1;
    piVar12 = piVar5 + 2;
    do {
      if (piVar12[-2] != iVar13) {
        piVar12 = piVar12 + -2;
        goto LAB_005acfe0;
      }
      if (piVar12[-1] != iVar13) {
        piVar12 = piVar12 + -1;
        goto LAB_005acfe0;
      }
      if (*piVar12 != iVar13) goto LAB_005acfe0;
      if (piVar12[1] != iVar13) {
        piVar12 = piVar12 + 1;
        goto LAB_005acfe0;
      }
      lVar15 = lVar15 + -1;
      piVar12 = piVar12 + 4;
    } while (1 < lVar15);
    uVar14 = (long)piVar6 - (long)piVar11;
    piVar12 = piVar11;
  }
  lVar15 = (long)uVar14 >> 2;
  if (lVar15 == 3) {
    iVar13 = *piVar5;
    if (*piVar12 == iVar13) {
      piVar12 = piVar12 + 1;
      goto LAB_005acfc9;
    }
  }
  else {
    if (lVar15 == 2) {
      iVar13 = *piVar5;
LAB_005acfc9:
      if (*piVar12 != iVar13) goto LAB_005acfe0;
      piVar12 = piVar12 + 1;
    }
    else {
      if (lVar15 != 1) goto LAB_005acfe9;
      iVar13 = *piVar5;
    }
    if (*piVar12 == iVar13) {
      piVar12 = piVar6;
    }
  }
LAB_005acfe0:
  if (piVar12 != piVar6) {
    return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01;
  }
LAB_005acfe9:
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01,1);
  return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01;
}

Assistant:

const std::vector<uint32_t>& GetDefiningBlocks(uint32_t bb_id) {
    assert(cfg_->block(bb_id) != nullptr && "Unknown basic block");
    std::vector<uint32_t>& defining_blocks = bb_to_defining_blocks_[bb_id];

    if (defining_blocks.size()) return defining_blocks;

    // Check if one of the loop exit basic block dominates |bb_id|.
    for (const BasicBlock* e_bb : exit_bb_) {
      if (dom_tree_.Dominates(e_bb->id(), bb_id)) {
        defining_blocks.push_back(e_bb->id());
        return defining_blocks;
      }
    }

    // Process parents, they will returns their suitable blocks.
    // If they are all the same, this means this basic block is dominated by a
    // common block, so we won't need to build a phi instruction.
    for (uint32_t pred_id : cfg_->preds(bb_id)) {
      const std::vector<uint32_t>& pred_blocks = GetDefiningBlocks(pred_id);
      if (pred_blocks.size() == 1)
        defining_blocks.push_back(pred_blocks[0]);
      else
        defining_blocks.push_back(pred_id);
    }
    assert(defining_blocks.size());
    if (std::all_of(defining_blocks.begin(), defining_blocks.end(),
                    [&defining_blocks](uint32_t id) {
                      return id == defining_blocks[0];
                    })) {
      // No need for a phi.
      defining_blocks.resize(1);
    }

    return defining_blocks;
  }